

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_kexact_gradient_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *gradient,REF_DBL *hessian)

{
  ulong uVar1;
  double dVar2;
  REF_NODE ref_node;
  REF_CLOUD pRVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  REF_CLOUD *one_layer;
  ulong uVar7;
  REF_DBL *pRVar8;
  REF_DBL *pRVar9;
  REF_DBL *pRVar10;
  double *pdVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  REF_CLOUD *ref_cloud_ptr;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  char *pcVar19;
  REF_CELL ref_cell;
  size_t __size;
  long lVar20;
  REF_INT item;
  int local_444;
  REF_DBL *local_440;
  REF_DBL *local_438;
  REF_DBL *local_430;
  REF_DBL *local_428;
  ulong local_420;
  REF_DBL *local_418;
  long local_410;
  long local_408;
  REF_CLOUD ref_cloud;
  REF_DBL local_3f8;
  double dStack_3f0;
  double local_3e8;
  double dStack_3e0;
  double local_3d8;
  double local_3d0;
  double dStack_3c8;
  double dStack_3c0;
  double dStack_3b8;
  ulong local_3a8;
  REF_DBL *local_3a0;
  REF_DBL *local_398;
  REF_GRID local_390;
  REF_DBL node_gradient [3];
  double local_358 [4];
  REF_DBL aRStack_338 [6];
  REF_DBL ab [90];
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    ref_cell = ref_grid->cell[8];
  }
  else {
    ref_cell = ref_grid->cell[3];
  }
  uVar14 = (ulong)ref_node->max;
  if ((long)uVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca,
           "ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD negative");
    return 1;
  }
  local_418 = gradient;
  local_390 = ref_grid;
  one_layer = (REF_CLOUD *)malloc(uVar14 * 8);
  if (one_layer == (REF_CLOUD *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca,
           "ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD NULL");
    return 2;
  }
  for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
    one_layer[uVar7] = (REF_CLOUD)0x0;
  }
  ref_cloud_ptr = one_layer;
  local_440 = scalar;
  local_438 = hessian;
  for (lVar20 = 0; lVar20 < (int)uVar14; lVar20 = lVar20 + 1) {
    if (-1 < ref_node->global[lVar20]) {
      uVar4 = ref_cloud_create(ref_cloud_ptr,4);
      if (uVar4 != 0) {
        uVar14 = (ulong)uVar4;
        pcVar19 = "cloud storage";
        uVar13 = 0x3cc;
        goto LAB_001d1824;
      }
      uVar14 = (ulong)(uint)ref_node->max;
    }
    ref_cloud_ptr = ref_cloud_ptr + 1;
  }
  uVar4 = ref_recon_local_immediate_cloud(one_layer,ref_node,ref_cell,local_440);
  if (uVar4 == 0) {
    uVar4 = ref_recon_ghost_cloud(one_layer,ref_node);
    if (uVar4 == 0) {
      local_398 = local_438;
      local_3a0 = local_418;
      pRVar10 = local_438;
      for (lVar20 = 0; uVar14 = (ulong)ref_node->max, lVar20 < (long)uVar14; lVar20 = lVar20 + 1) {
        if ((-1 < ref_node->global[lVar20]) && (ref_node->ref_mpi->id == ref_node->part[lVar20])) {
          uVar4 = ref_cloud_deep_copy(&ref_cloud,one_layer[lVar20]);
          if (uVar4 != 0) {
            uVar14 = (ulong)uVar4;
            pcVar19 = "create ref_cloud";
            uVar13 = 0x3d6;
            goto LAB_001d1824;
          }
          uVar4 = 2;
          uVar5 = 3;
          local_408 = lVar20;
LAB_001d0e83:
          lVar20 = local_408;
          if ((uVar5 == 0) || (8 < uVar4)) goto LAB_001d1746;
          uVar5 = ref_recon_grow_cloud_one_layer(ref_cloud,one_layer,ref_node);
          pRVar3 = ref_cloud;
          if (uVar5 != 0) {
            uVar14 = (ulong)uVar5;
            pcVar19 = "grow";
            uVar13 = 0x3da;
            goto LAB_001d1824;
          }
          local_440 = (REF_DBL *)CONCAT44(local_440._4_4_,uVar4);
          lVar12 = -1;
          if ((lVar20 < ref_node->max) &&
             (lVar12 = ref_node->global[lVar20], ref_node->global[lVar20] < 0)) {
            lVar12 = -1;
          }
          local_444 = local_390->twod;
          for (lVar20 = 0; lVar20 != 6; lVar20 = lVar20 + 1) {
            aRStack_338[lVar20] = 0.0;
          }
          for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
            node_gradient[lVar20] = 0.0;
          }
          uVar5 = ref_cloud_item(ref_cloud,lVar12,&item);
          if (uVar5 == 0) {
            uVar4 = pRVar3->naux;
            local_430 = (REF_DBL *)(long)(int)uVar4;
            uVar14 = 0;
            if (0 < (int)uVar4) {
              uVar14 = (ulong)uVar4;
            }
            for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
              local_358[uVar7] = pRVar3->aux[(long)(int)(item * uVar4) + uVar7];
            }
            uVar4 = (-(uint)(local_444 == 0) | 3) + pRVar3->n;
            uVar5 = 4;
            if (8 < (int)uVar4) {
              __size = (ulong)(uVar4 * 9) << 3;
              local_420 = (ulong)uVar4;
              local_410 = (long)pRVar3->n;
              pRVar8 = (REF_DBL *)malloc(__size);
              if (pRVar8 == (REF_DBL *)0x0) {
                uVar13 = 0x1cb;
                pcVar19 = "malloc a of REF_DBL NULL";
              }
              else {
                local_428 = pRVar8;
                pRVar8 = (REF_DBL *)malloc(__size);
                if (pRVar8 == (REF_DBL *)0x0) {
                  uVar13 = 0x1cc;
                  pcVar19 = "malloc q of REF_DBL NULL";
                }
                else {
                  pRVar9 = (REF_DBL *)malloc(0x288);
                  if (pRVar9 != (REF_DBL *)0x0) {
                    uVar14 = local_420 & 0xffffffff;
                    if (local_444 == 0) {
                      iVar6 = 0;
                    }
                    else {
                      local_3d8 = 0.0;
                      local_3e8 = 0.0;
                      dStack_3e0 = 0.0;
                      local_3f8 = 0.0;
                      dStack_3f0 = 0.0;
                      local_3d0 = 0.5;
                      dStack_3c8 = 0.0;
                      dStack_3c0 = 0.0;
                      dStack_3b8 = 1.0;
                      pRVar10 = local_428;
                      for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                        *pRVar10 = (&local_3f8)[lVar20];
                        pRVar10 = pRVar10 + uVar14;
                      }
                      local_3e8 = 0.0;
                      dStack_3e0 = 0.0;
                      local_3f8 = 0.0;
                      dStack_3f0 = 0.0;
                      local_3d8 = 0.0;
                      local_3d0 = 2.0;
                      dStack_3c8 = 0.0;
                      dStack_3c0 = 0.0;
                      dStack_3b8 = 2.0;
                      pRVar10 = local_428 + 1;
                      for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                        *pRVar10 = (&local_3f8)[lVar20];
                        pRVar10 = pRVar10 + uVar14;
                      }
                      local_3f8 = 0.5;
                      dStack_3f0 = 0.0;
                      local_3e8 = 1.0;
                      dStack_3e0 = 0.0;
                      local_3d8 = 0.0;
                      local_3d0 = 0.5;
                      dStack_3c8 = 1.0;
                      dStack_3c0 = 0.0;
                      dStack_3b8 = 1.0;
                      pRVar10 = local_428 + 2;
                      for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                        *pRVar10 = (&local_3f8)[lVar20];
                        pRVar10 = pRVar10 + uVar14;
                      }
                      local_3f8 = 0.0;
                      dStack_3f0 = 0.0;
                      local_3e8 = 0.0;
                      dStack_3e0 = 0.5;
                      local_3d8 = 1.0;
                      local_3d0 = 0.5;
                      dStack_3c8 = 0.0;
                      dStack_3c0 = 1.0;
                      dStack_3b8 = 1.0;
                      pRVar10 = local_428 + 3;
                      for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                        *pRVar10 = (&local_3f8)[lVar20];
                        pRVar10 = pRVar10 + uVar14;
                      }
                      iVar6 = 4;
                    }
                    item = 0;
                    lVar20 = -1;
                    if (0 < (int)local_410) {
                      lVar20 = *pRVar3->global;
                    }
                    lVar17 = 0;
                    if (0 < local_410) {
                      lVar17 = local_410;
                    }
                    lVar16 = 0;
                    while (lVar15 = lVar16, lVar16 = (long)iVar6, lVar15 != lVar17) {
                      if (lVar20 != lVar12) {
                        dStack_3b8 = pRVar3->aux[lVar15 * (long)local_430 + 2] - local_358[2];
                        pdVar11 = pRVar3->aux + lVar15 * (long)local_430;
                        dStack_3c8 = *pdVar11 - local_358[0];
                        dStack_3c0 = pdVar11[1] - local_358[1];
                        local_3f8 = dStack_3c8 * 0.5 * dStack_3c8;
                        dStack_3f0 = dStack_3c0 * dStack_3c8;
                        local_3e8 = dStack_3b8 * dStack_3c8;
                        dStack_3e0 = dStack_3c0 * 0.5 * dStack_3c0;
                        local_3d8 = dStack_3c0 * dStack_3b8;
                        local_3d0 = dStack_3b8 * 0.5 * dStack_3b8;
                        pRVar10 = local_428 + lVar16;
                        for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                          *pRVar10 = (&local_3f8)[lVar20];
                          pRVar10 = pRVar10 + uVar14;
                        }
                        iVar6 = iVar6 + 1;
                      }
                      lVar16 = lVar15 + 1;
                      item = (REF_INT)lVar16;
                      lVar20 = -1;
                      if (lVar16 < local_410) {
                        lVar20 = pRVar3->global[lVar15 + 1];
                      }
                    }
                    local_3a8 = uVar14;
                    if ((int)local_420 == iVar6) {
                      local_430 = pRVar9;
                      uVar5 = ref_matrix_qr((int)local_420,9,local_428,pRVar8,pRVar9);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,0x22f,"ref_recon_kexact_with_aux",(ulong)uVar5,"kexact lsq hess qr")
                        ;
                        pRVar10 = local_438;
                        goto LAB_001d0f59;
                      }
                      for (lVar20 = 0; lVar20 != 0x5a; lVar20 = lVar20 + 1) {
                        ab[lVar20] = 0.0;
                      }
                      pRVar10 = ab;
                      pRVar9 = local_430;
                      for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                        for (lVar17 = 0; lVar17 != 0x288; lVar17 = lVar17 + 0x48) {
                          *(double *)((long)pRVar10 + lVar17) =
                               *(double *)((long)pRVar9 + lVar17) +
                               *(double *)((long)pRVar10 + lVar17);
                        }
                        pRVar10 = pRVar10 + 1;
                        pRVar9 = pRVar9 + 1;
                      }
                      if (local_444 == 0) {
                        iVar6 = 0;
                      }
                      else {
                        pRVar10 = pRVar8;
                        for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                          ab[lVar20 + 0x51] = *pRVar10 * 0.0 + ab[lVar20 + 0x51];
                          pRVar10 = pRVar10 + uVar14;
                        }
                        pdVar11 = pRVar8 + 1;
                        for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                          ab[lVar20 + 0x51] = *pdVar11 * 0.0 + ab[lVar20 + 0x51];
                          pdVar11 = pdVar11 + uVar14;
                        }
                        pdVar11 = pRVar8 + 2;
                        for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                          ab[lVar20 + 0x51] = *pdVar11 * 0.0 + ab[lVar20 + 0x51];
                          pdVar11 = pdVar11 + uVar14;
                        }
                        pdVar11 = pRVar8 + 3;
                        for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                          ab[lVar20 + 0x51] = *pdVar11 * 0.0 + ab[lVar20 + 0x51];
                          pdVar11 = pdVar11 + uVar14;
                        }
                        iVar6 = 4;
                      }
                      item = 0;
                      uVar4 = pRVar3->n;
                      lVar20 = -1;
                      if (0 < (int)uVar4) {
                        lVar20 = *pRVar3->global;
                      }
                      uVar7 = 0;
                      if (0 < (int)uVar4) {
                        uVar7 = (ulong)uVar4;
                      }
                      uVar1 = 0;
                      while (uVar18 = uVar1, lVar16 = (long)iVar6, uVar18 != uVar7) {
                        if (lVar20 != lVar12) {
                          dVar2 = pRVar3->aux[(long)(int)uVar18 * (long)pRVar3->naux + 3];
                          pdVar11 = pRVar8 + lVar16;
                          for (lVar20 = 0; lVar20 != 9; lVar20 = lVar20 + 1) {
                            ab[lVar20 + 0x51] =
                                 *pdVar11 * (dVar2 - local_358[3]) + ab[lVar20 + 0x51];
                            pdVar11 = pdVar11 + uVar14;
                          }
                          iVar6 = iVar6 + 1;
                        }
                        uVar1 = uVar18 + 1;
                        item = (REF_INT)uVar1;
                        lVar20 = -1;
                        if (item < (int)uVar4) {
                          lVar20 = pRVar3->global[uVar18 + 1];
                        }
                      }
                      if ((int)local_420 == iVar6) {
                        uVar5 = ref_matrix_solve_ab(9,10,ab);
                        pRVar10 = local_438;
                        uVar4 = (uint)local_440;
                        if (uVar5 == 0) {
                          for (lVar20 = 0; lVar20 != 6; lVar20 = lVar20 + 1) {
                            aRStack_338[lVar20] = ab[lVar20 + 0x51];
                          }
                          for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
                            node_gradient[lVar20] = ab[lVar20 + 0x57];
                          }
                          free(local_430);
                          free(pRVar8);
                          free(local_428);
                          uVar5 = 0;
                          goto LAB_001d1245;
                        }
                        goto LAB_001d0f5d;
                      }
                      uVar13 = 0x256;
                      pcVar19 = "b row miscount";
                    }
                    else {
                      uVar13 = 0x22e;
                      pcVar19 = "A row miscount";
                    }
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,uVar13,"ref_recon_kexact_with_aux",pcVar19,local_3a8,lVar16);
                    uVar5 = 1;
                    pRVar10 = local_438;
                    goto LAB_001d1245;
                  }
                  uVar13 = 0x1cd;
                  pcVar19 = "malloc r of REF_DBL NULL";
                }
              }
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,uVar13,"ref_recon_kexact_with_aux",pcVar19);
              uVar5 = 2;
            }
LAB_001d1245:
            uVar4 = (uint)local_440;
LAB_001d1249:
            pcVar19 = "REF_DIV_ZERO";
            if ((uVar5 == 4 && 4 < uVar4) ||
               (pcVar19 = "REF_ILL_CONDITIONED", uVar5 == 8 && 4 < uVar4)) {
              ref_node_location(ref_node,(REF_INT)local_408);
              printf(" caught %s, for %d layers to kexact cloud; retry\n",pcVar19,(ulong)uVar4);
            }
            uVar4 = uVar4 + 1;
            goto LAB_001d0e83;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x1be,"ref_recon_kexact_with_aux",(ulong)uVar5,"missing center");
LAB_001d0f59:
          uVar4 = (uint)local_440;
LAB_001d0f5d:
          lVar20 = local_408;
          if (uVar5 != 5) goto LAB_001d1249;
          ref_node_location(ref_node,(REF_INT)local_408);
          printf(" caught %s, for %d layers to kexact cloud; zero gradient and hessian\n",
                 "REF_NOT_FOUND",(ulong)uVar4);
LAB_001d1746:
          if (local_418 != (REF_DBL *)0x0) {
            if (local_390->twod != 0) {
              node_gradient[2] = 0.0;
            }
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              local_3a0[lVar12] = node_gradient[lVar12];
            }
          }
          if (pRVar10 != (REF_DBL *)0x0) {
            if (local_390->twod != 0) {
              aRStack_338[2] = 0.0;
              aRStack_338[4] = 0.0;
              aRStack_338[5] = 0.0;
            }
            for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
              local_398[lVar12] = aRStack_338[lVar12];
            }
          }
          uVar4 = ref_cloud_free(ref_cloud);
          if (uVar4 != 0) {
            uVar14 = (ulong)uVar4;
            pcVar19 = "free ref_cloud";
            uVar13 = 0x404;
            goto LAB_001d1824;
          }
        }
        local_3a0 = local_3a0 + 3;
        local_398 = local_398 + 6;
      }
      for (lVar20 = 0; lVar20 < (int)uVar14; lVar20 = lVar20 + 1) {
        if (-1 < ref_node->global[lVar20]) {
          ref_cloud_free(one_layer[lVar20]);
          uVar14 = (ulong)(uint)ref_node->max;
        }
      }
      free(one_layer);
      if ((local_418 == (REF_DBL *)0x0) ||
         (uVar4 = ref_node_ghost_dbl(ref_node,local_418,3), uVar4 == 0)) {
        if (pRVar10 == (REF_DBL *)0x0) {
          return 0;
        }
        uVar4 = ref_node_ghost_dbl(ref_node,pRVar10,6);
        if (uVar4 == 0) {
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x412,"ref_recon_kexact_gradient_hessian",(ulong)uVar4,"update ghosts");
        return uVar4;
      }
      uVar14 = (ulong)uVar4;
      pcVar19 = "update ghosts";
      uVar13 = 0x40e;
    }
    else {
      uVar14 = (ulong)uVar4;
      pcVar19 = "fill ghosts";
      uVar13 = 0x3d1;
    }
  }
  else {
    uVar14 = (ulong)uVar4;
    pcVar19 = "fill immediate cloud";
    uVar13 = 0x3d0;
  }
LAB_001d1824:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar13,
         "ref_recon_kexact_gradient_hessian",uVar14,pcVar19);
  return (REF_STATUS)uVar14;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_kexact_gradient_hessian(REF_GRID ref_grid,
                                                            REF_DBL *scalar,
                                                            REF_DBL *gradient,
                                                            REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL node_gradient[3], node_hessian[6];
  REF_STATUS status;
  REF_CLOUD *one_layer;
  REF_INT layer;

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }

  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");
        status = ref_recon_kexact_with_aux(ref_node_global(ref_node, node),
                                           ref_cloud, ref_grid_twod(ref_grid),
                                           node_gradient, node_hessian);
        if (REF_NOT_FOUND == status) {
          ref_node_location(ref_node, node);
          printf(
              " caught %s, for %d layers to kexact cloud; "
              "zero gradient and hessian\n",
              "REF_NOT_FOUND", layer);
          status = REF_SUCCESS;
          break;
        }
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      if (NULL != gradient) {
        if (ref_grid_twod(ref_grid)) {
          node_gradient[2] = 0.0;
        }
        for (im = 0; im < 3; im++) {
          gradient[im + 3 * node] = node_gradient[im];
        }
      }
      if (NULL != hessian) {
        if (ref_grid_twod(ref_grid)) {
          node_hessian[2] = 0.0;
          node_hessian[4] = 0.0;
          node_hessian[5] = 0.0;
        }
        for (im = 0; im < 6; im++) {
          hessian[im + 6 * node] = node_hessian[im];
        }
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  if (NULL != gradient) {
    RSS(ref_node_ghost_dbl(ref_node, gradient, 3), "update ghosts");
  }

  if (NULL != hessian) {
    RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");
  }

  return REF_SUCCESS;
}